

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__file.cc
# Opt level: O1

void __thiscall xemmai::io::t_file::t_file(t_file *this,wstring_view a_path,wstring_view a_mode)

{
  wchar_t wVar1;
  int iVar2;
  int *piVar3;
  wchar_t *pwVar4;
  int __oflag;
  wchar_t *pwVar5;
  long in_FS_OFFSET;
  wstring_view a_string;
  wstring_view a_message;
  string local_50;
  
  pwVar5 = a_mode._M_str;
  pwVar4 = (wchar_t *)a_mode._M_len;
  a_string._M_len = a_path._M_str;
  (this->super_t_sharable).super_t_owned.v_owner = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  (this->super_t_sharable).v_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->super_t_sharable).v_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x30) = 0;
  this->v_own = true;
  if (pwVar4 != (wchar_t *)0x2) {
    if (pwVar4 != (wchar_t *)0x1) goto LAB_0017177b;
    wVar1 = *pwVar5;
    if (wVar1 == L'a') {
      __oflag = 0x441;
      goto LAB_00171710;
    }
    if (wVar1 == L'r') {
      __oflag = 0;
      goto LAB_00171710;
    }
    if (wVar1 == L'w') {
      __oflag = 0x241;
      goto LAB_00171710;
    }
  }
  if (pwVar5[1] == L'+') {
    wVar1 = *pwVar5;
    if (wVar1 == L'a') {
      __oflag = 0x442;
    }
    else {
      __oflag = 2;
      if (wVar1 != L'r') {
        if (wVar1 != L'w') goto LAB_0017177b;
        __oflag = 0x242;
      }
    }
LAB_00171710:
    while( true ) {
      a_string._M_str = pwVar4;
      portable::f_convert_abi_cxx11_(&local_50,(portable *)a_path._M_len,a_string);
      iVar2 = open(local_50._M_dataplus._M_p,__oflag,0x1ff);
      this->v_fd = iVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (this->v_fd != -1) break;
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        portable::f_throw_system_error();
      }
    }
    return;
  }
LAB_0017177b:
  a_message._M_str = a_string._M_len;
  a_message._M_len = (size_t)L"invalid mode.";
  f_throw((xemmai *)0xd,a_message);
}

Assistant:

t_file::t_file(std::wstring_view a_path, std::wstring_view a_mode) : v_own(true)
{
	auto flags = [&]
	{
		switch (a_mode.size()) {
		case 1:
			switch (a_mode[0]) {
			case L'r':
				return O_RDONLY;
			case L'w':
				return O_WRONLY | O_CREAT | O_TRUNC;
			case L'a':
				return O_WRONLY | O_CREAT | O_APPEND;
			}
		case 2:
			if (a_mode[1] == L'+')
				switch (a_mode[0]) {
				case L'r':
					return O_RDWR;
				case L'w':
					return O_RDWR | O_CREAT | O_TRUNC;
				case L'a':
					return O_RDWR | O_CREAT | O_APPEND;
				}
		}
		f_throw(L"invalid mode."sv);
	}();
	while (true) {
#ifdef _WIN32
		v_fd = open(portable::f_convert(a_path).c_str(), flags, S_IREAD | S_IWRITE);
#else
		v_fd = open(portable::f_convert(a_path).c_str(), flags, S_IRWXU | S_IRWXG | S_IRWXO);
#endif
		if (v_fd != -1) break;
		if (errno != EINTR) portable::f_throw_system_error();
	}
}